

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O2

void blend_color_generic_rgb64(int count,QT_FT_Span *spans,void *userData)

{
  long lVar1;
  char cVar2;
  QThreadPool *pQVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long in_FS_OFFSET;
  QSemaphore semaphore;
  anon_class_40_6_31ab0bab local_110;
  Operator op;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  memcpy(&op,&DAT_0061d730,0xb0);
  getOperator(&op,(QSpanData *)userData,(QT_FT_Span *)0x0,0);
  if (op.funcSolid64 == (CompositionFunctionSolid64)0x0) {
    lcQtGuiDrawHelper();
    if (((byte)lcQtGuiDrawHelper::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) !=
        0) {
      local_110.op._0_4_ = 2;
      local_110.op._4_4_ = 0;
      local_110.spans._0_4_ = 0;
      local_110.spans._4_4_ = 0;
      local_110.solidFill = false;
      local_110._17_3_ = 0;
      local_110.bpp = BPPNone;
      local_110.data = (QSpanData *)lcQtGuiDrawHelper::category.name;
      QMessageLogger::debug
                ((char *)&local_110,
                 "blend_color_generic_rgb64: unsupported 64bit blend attempted, falling back to 32-bit"
                );
    }
    blend_color_generic(count,spans,userData);
  }
  else {
    local_110.color = QColor::rgba64((QColor *)((long)userData + 0x98));
    local_110.bpp = qPixelLayouts[*(uint *)(*userData + 0x10)].bpp;
    local_110._17_3_ = 0xaaaaaa;
    local_110.solidFill = op.mode == CompositionMode_Source;
    local_110.data = (QSpanData *)userData;
    local_110.op = &op;
    local_110.spans = spans;
    pQVar3 = QGuiApplicationPrivate::qtGuiThreadPool();
    if (((0x5f < count) && (pQVar3 != (QThreadPool *)0x0)) &&
       (2 < (int)qPixelLayouts[*(uint *)(*userData + 0x10)].bpp)) {
      QThread::currentThread();
      cVar2 = QThreadPool::contains((QThread *)pQVar3);
      if (cVar2 == '\0') {
        _semaphore = &DAT_aaaaaaaaaaaaaaaa;
        iVar7 = 0;
        QSemaphore::QSemaphore(&semaphore,0);
        iVar6 = (count + 0x20) / 0x40;
        while (iVar6 != 0) {
          iVar8 = (count - iVar7) / iVar6;
          puVar4 = (undefined8 *)operator_new(0x18);
          *(undefined1 *)(puVar4 + 1) = 1;
          *puVar4 = QFactoryLoader::keyMap;
          puVar5 = (undefined8 *)operator_new(0x20);
          *puVar5 = QRunnable::QGenericRunnable::
                    Helper<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/gui/painting/qdrawhelper.cpp:4099:5)>
                    ::impl;
          *(int *)(puVar5 + 1) = iVar7;
          *(int *)((long)puVar5 + 0xc) = iVar8;
          puVar5[2] = &local_110;
          puVar5[3] = &semaphore;
          puVar4[2] = puVar5;
          QThreadPool::start((QRunnable *)pQVar3,(int)puVar4);
          iVar7 = iVar7 + iVar8;
          iVar6 = iVar6 + -1;
        }
        QSemaphore::acquire((int)&semaphore);
        QSemaphore::~QSemaphore(&semaphore);
        goto LAB_005a9699;
      }
    }
    blend_color_generic_rgb64::anon_class_40_6_31ab0bab::operator()(&local_110,0,count);
  }
LAB_005a9699:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void blend_color_generic_rgb64(int count, const QT_FT_Span *spans, void *userData)
{
#if QT_CONFIG(raster_64bit)
    QSpanData *data = reinterpret_cast<QSpanData *>(userData);
    const Operator op = getOperator(data, nullptr, 0);
    if (!op.funcSolid64) {
        qCDebug(lcQtGuiDrawHelper, "blend_color_generic_rgb64: unsupported 64bit blend attempted, falling back to 32-bit");
        return blend_color_generic(count, spans, userData);
    }

    const QRgba64 color = data->solidColor.rgba64();
    const bool solidFill = op.mode == QPainter::CompositionMode_Source;
    const QPixelLayout::BPP bpp = qPixelLayouts[data->rasterBuffer->format].bpp;

    auto function = [=, &op] (int cStart, int cEnd)
    {
        alignas(16) Q_DECL_UNINITIALIZED QRgba64 buffer[BufferSize];
        for (int c = cStart; c < cEnd; ++c) {
            int x = spans[c].x;
            int length = spans[c].len;
            if (solidFill && bpp >= QPixelLayout::BPP8 && spans[c].coverage == 255 && length && op.destStore64) {
                // If dest doesn't matter we don't need to bother with blending or converting all the identical pixels
                op.destStore64(data->rasterBuffer, x, spans[c].y, &color, 1);
                spanfill_from_first(data->rasterBuffer, bpp, x, spans[c].y, length);
                length = 0;
            }

            while (length) {
                int l = qMin(BufferSize, length);
                QRgba64 *dest = op.destFetch64(buffer, data->rasterBuffer, x, spans[c].y, l);
                op.funcSolid64(dest, l, color, spans[c].coverage);
                if (op.destStore64)
                    op.destStore64(data->rasterBuffer, x, spans[c].y, dest, l);
                length -= l;
                x += l;
            }
        }
    };
    QT_THREAD_PARALLEL_FILLS(function);
#else
    blend_color_generic(count, spans, userData);
#endif
}